

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::merge
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          object_iterator hint,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *source)

{
  object_iterator hint_00;
  object_iterator hint_01;
  json_storage_kind jVar1;
  json_storage_kind jVar2;
  undefined8 uVar3;
  json_runtime_error<std::domain_error,_void> *this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RCX;
  undefined8 in_RSI;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RDI;
  string *in_stack_ffffffffffffff08;
  json_runtime_error<std::domain_error,_void> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff57;
  order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  iterator in_stack_ffffffffffffff90;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var5;
  
  _Var5._M_current = in_RDI;
  jVar1 = storage_kind(in_RCX);
  if (jVar1 != empty_object) {
    if (jVar1 == json_reference) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff10);
      json_reference_storage::value((json_reference_storage *)0xb94374);
      hint_01._8_8_ = in_RSI;
      hint_01.it_._M_current = _Var5._M_current;
      merge(in_RCX,hint_01,in_stack_ffffffffffffffd8);
    }
    else {
      if (jVar1 != object) {
        uVar4 = 1;
        this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(uVar4,CONCAT15(jVar1,in_stack_ffffffffffffff50))),
                   (char *)in_RDI,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
        ;
        json_runtime_error<std::domain_error,_void>::json_runtime_error
                  (this_00,in_stack_ffffffffffffff08);
        __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                    json_runtime_error<std::domain_error,_void>::~json_runtime_error);
      }
      jVar2 = storage_kind((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)in_RDI);
      if (jVar2 == empty_object) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        create_object_implicitly<std::allocator<char>>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff50))));
        detail::random_access_iterator_wrapper::operator_cast_to___normal_iterator
                  ((random_access_iterator_wrapper *)&stack0xfffffffffffffff0);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff50))));
        order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
        ::merge((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff90,in_stack_ffffffffffffff80);
      }
      else if (jVar2 == json_reference) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
        json_reference_storage::value((json_reference_storage *)0xb94221);
        hint_00._8_8_ = in_RSI;
        hint_00.it_._M_current = _Var5._M_current;
        merge(in_RCX,hint_00,in_stack_ffffffffffffffd8);
      }
      else {
        if (jVar2 != object) {
          uVar3 = __cxa_allocate_exception(0x18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff57,
                              CONCAT16(in_stack_ffffffffffffff56,
                                       CONCAT15(jVar1,in_stack_ffffffffffffff50))),(char *)in_RDI,
                     (allocator<char> *)CONCAT17(jVar2,in_stack_ffffffffffffff40));
          json_runtime_error<std::domain_error,_void>::json_runtime_error
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          __cxa_throw(uVar3,&json_runtime_error<std::domain_error,void>::typeinfo,
                      json_runtime_error<std::domain_error,_void>::~json_runtime_error);
        }
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff50))));
        detail::random_access_iterator_wrapper::operator_cast_to___normal_iterator
                  ((random_access_iterator_wrapper *)&stack0xfffffffffffffff0);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
        value_abi_cxx11_((object_storage *)
                         CONCAT17(in_stack_ffffffffffffff57,
                                  CONCAT16(in_stack_ffffffffffffff56,
                                           CONCAT15(jVar1,in_stack_ffffffffffffff50))));
        order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
        ::merge((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff90,in_stack_ffffffffffffff80);
      }
    }
  }
  return;
}

Assistant:

void merge(object_iterator hint, basic_json&& source)
        {
            switch (source.storage_kind())
            {
                case json_storage_kind::empty_object:
                    break;
                case json_storage_kind::object:
                    switch (storage_kind())
                    {
                        case json_storage_kind::empty_object:
                            create_object_implicitly();
                            cast<object_storage>().value().merge(hint, std::move(source.cast<object_storage>().value()));
                            break;
                        case json_storage_kind::object:
                            cast<object_storage>().value().merge(hint, std::move(source.cast<object_storage>().value()));
                            break;
                        case json_storage_kind::json_reference:
                            cast<json_reference_storage>().value().merge(hint, std::move(source));
                            break;
                        default:
                            JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to merge a value that is not an object"));
                    }
                    break;
                case json_storage_kind::json_reference:
                    merge(hint, std::move(source.cast<json_reference_storage>().value()));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to merge a value that is not an object"));
            }
        }